

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O0

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalDummyScan,duckdb::vector<duckdb::LogicalType,true>&,unsigned_long&>
          (PhysicalPlan *this,vector<duckdb::LogicalType,_true> *args,unsigned_long *args_1)

{
  PhysicalOperator *pPVar1;
  ArenaAllocator *in_RDI;
  PhysicalDummyScan *ptr;
  data_ptr_t mem;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff88;
  ArenaAllocator *__uref;
  undefined1 *estimated_cardinality;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffffa8;
  PhysicalDummyScan *in_stack_ffffffffffffffb0;
  undefined1 local_40 [24];
  PhysicalOperator *local_28;
  PhysicalOperator *local_20;
  
  pPVar1 = (PhysicalOperator *)
           ArenaAllocator::AllocateAligned(in_RDI,(idx_t)in_stack_ffffffffffffff88);
  estimated_cardinality = local_40;
  local_20 = pPVar1;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_RDI,in_stack_ffffffffffffff88);
  PhysicalDummyScan::PhysicalDummyScan
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(idx_t)estimated_cardinality);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x7677cd);
  __uref = in_RDI + 1;
  local_28 = pPVar1;
  ::std::reference_wrapper<duckdb::PhysicalOperator>::
  reference_wrapper<duckdb::PhysicalDummyScan&,void,duckdb::PhysicalOperator*>
            ((reference_wrapper<duckdb::PhysicalOperator> *)in_RDI,(PhysicalDummyScan *)__uref);
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ::push_back((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               *)in_RDI,(value_type *)__uref);
  return local_28;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}